

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::set_priority(raft_server *this,int srv_id,int new_priority)

{
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *plVar1;
  element_type *peVar2;
  int *piVar3;
  undefined8 this_00;
  undefined8 uVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  element_type *peVar8;
  long *plVar9;
  uint uVar10;
  ptr<buffer> new_conf_buf;
  ptr<cluster_config> cloned_config;
  ptr<log_entry> entry;
  ptr<cluster_config> cur_config;
  ptr<buffer> enc_conf;
  unique_lock<std::recursive_mutex> guard;
  log_val_type local_be;
  undefined1 local_bd;
  uint local_bc;
  undefined1 local_b8 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  ptr<log_entry> local_80;
  undefined1 local_70 [40];
  undefined1 local_48;
  unsigned_long local_40;
  __atomic_base<unsigned_long> local_38;
  
  local_70._32_8_ = &this->lock_;
  local_48 = 0;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)(local_70 + 0x20));
  local_48 = 1;
  if (this->id_ == (this->leader_).super___atomic_base<int>._M_i) {
    if ((new_priority == 0) && (this->id_ == srv_id)) {
      broadcast_priority_change(this,srv_id,0);
    }
    get_config((raft_server *)local_70);
    peVar8 = (this->uncommitted_config_).
             super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar8 != (element_type *)0x0) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar5 = (**(code **)(*(long *)peVar2 + 0x38))();
        peVar8 = (this->uncommitted_config_).
                 super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (3 < iVar5) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_b8,"uncommitted config exists at log %lu, prev log %lu",
                     peVar8->log_idx_,peVar8->prev_log_idx_);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                     ,"set_priority",0x44,local_b8);
          if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
            operator_delete((void *)local_b8._0_8_);
          }
          peVar8 = (this->uncommitted_config_).
                   super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
      }
      local_70._0_8_ = peVar8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8),
                 &(this->uncommitted_config_).
                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    cluster_config::serialize((cluster_config *)(local_70 + 0x10));
    local_bc = new_priority;
    local_b8._32_8_ = this;
    cluster_config::deserialize((cluster_config *)(local_b8 + 0x28),(buffer *)local_70._16_8_);
    plVar1 = (list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              *)(local_b8._40_8_ + 0x38);
    plVar9 = (long *)(((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                        *)(local_b8._40_8_ + 0x38))->
                     super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next;
    if ((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
         *)plVar9 != plVar1) {
      uVar10 = local_bc;
      do {
        piVar3 = (int *)plVar9[2];
        if (*piVar3 == srv_id) {
          peVar2 = (((ptr<logger> *)(local_b8._32_8_ + 0x318))->
                   super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if ((peVar2 != (element_type *)0x0) &&
             (iVar5 = (**(code **)(*(long *)peVar2 + 0x38))(), 3 < iVar5)) {
            peVar2 = (((ptr<logger> *)(local_b8._32_8_ + 0x318))->
                     super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_b8,"Change server %d priority %d -> %d",(ulong)(uint)srv_id,
                       (ulong)(uint)piVar3[0x13],(ulong)uVar10);
            (**(code **)(*(long *)peVar2 + 0x40))
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                       ,"set_priority",0x51,(string *)local_b8);
            uVar10 = local_bc;
            if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
              operator_delete((void *)local_b8._0_8_);
            }
          }
          piVar3[0x13] = uVar10;
        }
        plVar9 = (long *)*plVar9;
      } while ((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                *)plVar9 != plVar1);
    }
    uVar4 = local_b8._40_8_;
    this_00 = local_b8._32_8_;
    uVar6 = (**(code **)(*(long *)(((ptr<log_store> *)(local_b8._32_8_ + 0x2e0))->
                                  super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr + 0x10))();
    *(ulong *)(uVar4 + 8) = *(ulong *)uVar4;
    *(undefined8 *)uVar4 = uVar6;
    cluster_config::serialize((cluster_config *)local_b8);
    local_38._M_i =
         (((((ptr<srv_state> *)(this_00 + 0x2d0))->
           super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->term_).
         super___atomic_base<unsigned_long>._M_i;
    local_be = conf;
    lVar7 = std::chrono::_V2::system_clock::now();
    local_40 = lVar7 / 1000;
    local_80.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              (&local_80.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(log_entry **)&local_80,(allocator<nuraft::log_entry> *)&local_bd,
               &local_38._M_i,(shared_ptr<nuraft::buffer> *)local_b8,&local_be,&local_40);
    *(bool *)(this_00 + 0xe9) = true;
    (((ptr<cluster_config> *)(this_00 + 0x390))->
    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)local_b8._40_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(((ptr<cluster_config> *)(this_00 + 0x390))->
                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               &local_88);
    store_log_entry((raft_server *)this_00,&local_80,0);
    request_append_entries((raft_server *)this_00);
    if (local_80.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
    if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
    }
    if (local_70._24_8_ != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._24_8_);
    }
    if ((element_type *)local_70._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
  }
  else {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) &&
       (iVar5 = (**(code **)(*(long *)peVar2 + 0x38))(), 3 < iVar5)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_b8,
                 "Got set_priority request but I\'m not a leader: my ID %d, leader %d",
                 (ulong)(uint)this->id_,(ulong)(uint)(this->leader_).super___atomic_base<int>._M_i);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                 ,"set_priority",0x2a,local_b8);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_);
      }
    }
    if (((this->leader_).super___atomic_base<int>._M_i == -1) ||
       (((this->hb_alive_)._M_base._M_i & 1U) == 0)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) &&
         (iVar5 = (**(code **)(*(long *)peVar2 + 0x38))(), 2 < iVar5)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_b8,"No live leader now, broadcast priority change");
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                   ,"set_priority",0x2d,local_b8);
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_);
        }
      }
      broadcast_priority_change(this,srv_id,new_priority);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)(local_70 + 0x20));
  return;
}

Assistant:

void raft_server::set_priority(const int srv_id, const int new_priority)
{
    recur_lock(lock_);

    // Do nothing if not a leader.
    if (id_ != leader_) {
        p_in("Got set_priority request but I'm not a leader: my ID %d, leader %d",
             id_, leader_.load());

        if (!is_leader_alive()) {
            p_wn("No live leader now, broadcast priority change");
            broadcast_priority_change(srv_id, new_priority);
        }
        return;
    }

    if (id_ == srv_id && new_priority == 0) {
        // Step down.
        // Even though current leader (myself) can send append_entries()
        // request, it cannot commit the priority change as it will
        // immediately yield its leadership.
        // So in this case, boradcast this change.
        broadcast_priority_change(srv_id, new_priority);
    }

    // Clone current cluster config.
    ptr<cluster_config> cur_config = get_config();

    // NOTE: Need to honor uncommitted config,
    //       refer to comment in `sync_log_to_new_srv()`
    if (uncommitted_config_) {
        p_in("uncommitted config exists at log %" PRIu64 ", prev log %" PRIu64,
             uncommitted_config_->get_log_idx(),
             uncommitted_config_->get_prev_log_idx());
        cur_config = uncommitted_config_;
    }

    ptr<buffer> enc_conf = cur_config->serialize();
    ptr<cluster_config> cloned_config = cluster_config::deserialize(*enc_conf);

    std::list<ptr<srv_config>>& s_confs = cloned_config->get_servers();

    for (auto& entry: s_confs) {
        srv_config* s_conf = entry.get();
        if (s_conf->get_id() == srv_id) {
            p_in("Change server %d priority %d -> %d",
                 srv_id, s_conf->get_priority(), new_priority);
            s_conf->set_priority(new_priority);
        }
    }

    // Create a log for new configuration, it should be replicated.
    cloned_config->set_log_idx(log_store_->next_slot());
    ptr<buffer> new_conf_buf(cloned_config->serialize());
    ptr<log_entry> entry( cs_new<log_entry>
                          ( state_->get_term(),
                            new_conf_buf,
                            log_val_type::conf,
                            timer_helper::get_timeofday_us() ) );

    config_changing_ = true;
    uncommitted_config_ = cloned_config;

    store_log_entry(entry);
    request_append_entries();
}